

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

void doCommand(FILE *outf,int method,atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,
              atomBins *bbins,pointSet *dots,float probeRad,float density,float spikelen,
              int countDots,int rawOutput,int conFlag,char *rawname,double scoreBias,int drawSpike,
              int sayGroup,char *groupLabel,int argc,char **argv,char *message)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  atom_t *allMovingAtoms_00;
  ulong uVar4;
  atom_t *paVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  int iVar11;
  atom *a;
  atom *a_1;
  bool bVar12;
  bool bVar13;
  char extrastr [32];
  dotNode *rslts [114] [7];
  dotNode *(*results) [7];
  char local_1948 [32];
  dotNode *local_1928 [799];
  
  bVar12 = bbins == (atomBins *)0x0;
  allMovingAtoms_00 = allMovingAtoms;
  if (bVar12) {
    allMovingAtoms_00 = (atom *)0x0;
  }
  bVar13 = allMovingAtoms == (atom *)0x0;
  if (bVar13) {
    bbins = (atomBins *)0x0;
  }
  memset(local_1928,0,0x18f0);
  if (((countDots == 0) && (rawOutput != 0)) && ((Verbose & 1) == 0)) {
    pcVar6 = 
    ">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:kissEdge2BullsEye:dot2BE:dot2SC:spike:score:stype:ttype:x:y:z:sBval:tBval"
    ;
    if (conFlag == 0) {
      pcVar6 = 
      ">>name:pat:type:srcAtom:targAtom:min-gap:gap:kissEdge2BullsEye:dot2BE:dot2SC:spike:score:stype:ttype:x:y:z:sBval:tBval"
      ;
    }
    pcVar10 = 
    ">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval"
    ;
    if (conFlag == 0) {
      pcVar10 = 
      ">>name:pat:type:srcAtom:targAtom:min-gap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval"
      ;
    }
    if (OldStyleU != '\0') {
      pcVar10 = pcVar6;
    }
    note(pcVar10);
  }
  switch(method) {
  case 0:
    if ((countDots == 0 || rawOutput == 0) && ((Verbose & 1) == 0)) {
      note("ExternalSurface");
    }
    results = (dotNode *(*) [7])local_1928;
    genDotSurface(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,1,results);
    iVar2 = (int)results;
    if (countDots == 0) {
      if (rawOutput == 0) {
        if (OutputFmtType != 2) {
          if (OutputFmtType != 1) {
            descrCommand(outf,"@caption"," command:",argc,argv);
            if (sayGroup != 0) {
              pcVar6 = "dots";
              if (groupLabel != (char *)0x0) {
                pcVar6 = groupLabel;
              }
              fprintf((FILE *)outf,"@group dominant {%s}\n",pcVar6);
            }
            pcVar6 = "dots";
            if (groupLabel != (char *)0x0) {
              pcVar6 = groupLabel;
            }
            strcpy(local_1948,pcVar6);
            pcVar6 = "extern dots";
            drawSpike = 0;
            iVar2 = 0;
LAB_0012bdff:
            writeOutput(outf,pcVar6,(dotNode *(*) [7])local_1928,drawSpike,iVar2,local_1948,probeRad
                       );
            break;
          }
          pcVar6 = "extern_dots";
          uVar9 = 1;
          drawSpike = 0;
LAB_0012b9ab:
          writeAltFmtO(outf,uVar9,1,pcVar6,(dotNode *(*) [7])local_1928,drawSpike);
          break;
        }
        descrCommand(outf,"# software:","# command:",argc,argv);
        pcVar6 = "extern_dots";
        uVar9 = 1;
        drawSpike = 0;
LAB_0012bc15:
        writeAltFmtXV(outf,uVar9,1,pcVar6,(dotNode *(*) [7])local_1928,drawSpike);
        break;
      }
      pcVar6 = "";
      if (groupLabel != (char *)0x0) {
        pcVar6 = groupLabel;
      }
      pcVar10 = "1->none";
LAB_0012b915:
      writeRaw(outf,pcVar10,(dotNode *(*) [7])local_1928,probeRad,pcVar6,density,conFlag);
      break;
    }
    if (rawOutput == 0) {
      descrCommand(outf,"program:","command:",argc,argv);
    }
    iVar7 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
    if (rawOutput == 0) {
      pcVar6 = "dots";
      if (groupLabel != (char *)0x0) {
        pcVar6 = groupLabel;
      }
      fprintf((FILE *)outf,"selection: external\nname: %s\n",pcVar6);
      fprintf((FILE *)outf,
              "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
              (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
    }
    if (bVar13 || bVar12) {
      if (allMainAtoms == (atom *)0x0) {
        iVar11 = 0;
      }
      else {
        iVar11 = 0;
        do {
          iVar11 = iVar11 + (allMainAtoms->flags & 1U);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
    }
    else {
      iVar11 = 0;
      iVar3 = 0;
      if (allMainAtoms != (atom *)0x0) {
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (allMainAtoms->flags & 1U);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
      if (allMovingAtoms_00 != (atom *)0x0) {
        iVar11 = 0;
        do {
          iVar11 = iVar11 + (allMovingAtoms_00->flags & 1U);
          allMovingAtoms_00 = allMovingAtoms_00->next;
        } while (allMovingAtoms_00 != (atom_t *)0x0);
      }
      iVar11 = iVar11 + iVar3;
    }
    if (rawOutput != 0) {
      pcVar10 = "";
      if (groupLabel == (char *)0x0) {
        groupLabel = "";
      }
      iVar3 = 0;
      drawSpike = 0;
LAB_0012ba0a:
      rawEnumerate(outf,pcVar10,(dotNode *(*) [7])local_1928,iVar3,iVar11,drawSpike,iVar2,iVar7,
                   density,groupLabel,rawname,scoreBias);
      break;
    }
    iVar3 = 1;
    pcVar6 = "extern dots";
    iVar2 = 0;
    drawSpike = 0;
    goto LAB_0012ba44;
  case 1:
    if ((countDots == 0 || rawOutput == 0) && ((Verbose & 1) == 0)) {
      note("IntersectOnce");
    }
    iVar2 = 2;
    genDotIntersect(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,1,2,
                    (dotNode *(*) [7])local_1928);
    if (countDots == 0) {
      if (rawOutput != 0) {
        pcVar6 = "";
        if (groupLabel != (char *)0x0) {
          pcVar6 = groupLabel;
        }
        pcVar10 = "1->2";
        goto LAB_0012b915;
      }
      if (OutputFmtType != 3) {
        if (OutputFmtType == 2) {
          descrCommand(outf,"# software:","# command:",argc,argv);
          pcVar6 = "once_dots";
          uVar9 = 1;
          goto LAB_0012bc15;
        }
        if (OutputFmtType != 1) {
          if (ContactSUMMARY == '\x01') {
            countsummary(outf,"IntersectOnce",9,1);
          }
          descrCommand(outf,"@caption"," command:",argc,argv);
          if (sayGroup != 0) {
            pcVar6 = "dots";
            if (groupLabel != (char *)0x0) {
              pcVar6 = groupLabel;
            }
            fprintf((FILE *)outf,"@group dominant {%s}\n",pcVar6);
          }
          pcVar6 = "dots";
          if (groupLabel != (char *)0x0) {
            pcVar6 = groupLabel;
          }
          strcpy(local_1948,pcVar6);
          pcVar6 = "once dots";
          iVar2 = 1;
          goto LAB_0012bdff;
        }
        pcVar6 = "once_dots";
        uVar9 = 1;
        goto LAB_0012b9ab;
      }
      pcVar6 = "IntersectOnce";
      iVar2 = 1;
      iVar7 = 1;
LAB_0012bd35:
      countsummary(outf,pcVar6,iVar2,iVar7);
      break;
    }
    if (rawOutput == 0) {
      descrCommand(outf,"program:","command:",argc,argv);
    }
    iVar7 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
    if (rawOutput == 0) {
      pcVar6 = "dots";
      if (groupLabel != (char *)0x0) {
        pcVar6 = groupLabel;
      }
      fprintf((FILE *)outf,"selection: once\nname: %s\n",pcVar6);
      fprintf((FILE *)outf,
              "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
              (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
      fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
              (double)BUMPweight,(double)HBweight);
    }
    if (bVar13 || bVar12) {
      if (allMainAtoms == (atom *)0x0) {
        iVar11 = 0;
      }
      else {
        iVar11 = 0;
        do {
          iVar11 = iVar11 + (allMainAtoms->flags & 1U);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
    }
    else {
      iVar11 = 0;
      iVar3 = 0;
      if (allMainAtoms != (atom *)0x0) {
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (allMainAtoms->flags & 1U);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
      if (allMovingAtoms_00 != (atom *)0x0) {
        iVar11 = 0;
        do {
          iVar11 = iVar11 + (allMovingAtoms_00->flags & 1U);
          allMovingAtoms_00 = allMovingAtoms_00->next;
        } while (allMovingAtoms_00 != (atom_t *)0x0);
      }
      iVar11 = iVar11 + iVar3;
    }
    if (rawOutput != 0) {
      pcVar10 = "";
      if (groupLabel == (char *)0x0) {
        groupLabel = "";
      }
      iVar3 = 1;
      goto LAB_0012ba0a;
    }
    pcVar6 = "once dots";
    iVar2 = 1;
    goto LAB_0012ba3c;
  case 2:
    if ((countDots == 0 || rawOutput == 0) && ((Verbose & 1) == 0)) {
      note("IntersectBothWays");
    }
    if (countDots == 0) {
      if (OutputFmtType != 1 && rawOutput == 0) {
        if (OutputFmtType == 2) {
          descrCommand(outf,"# software:","# command:",argc,argv);
        }
        else {
          descrCommand(outf,"@caption"," command:",argc,argv);
          if (sayGroup != 0) {
            pcVar6 = "dots";
            if (groupLabel != (char *)0x0) {
              pcVar6 = groupLabel;
            }
            fprintf((FILE *)outf,"@group {%s}\n",pcVar6);
          }
        }
      }
    }
    else if (rawOutput == 0) {
      descrCommand(outf,"program:","command:",argc,argv);
      pcVar6 = "dots";
      if (groupLabel != (char *)0x0) {
        pcVar6 = groupLabel;
      }
      fprintf((FILE *)outf,"selection: both\nname: %s\n",pcVar6);
      fprintf((FILE *)outf,
              "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
              (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
      fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
              (double)BUMPweight,(double)HBweight);
    }
    iVar2 = 2;
    genDotIntersect(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,1,2,
                    (dotNode *(*) [7])local_1928);
    if (countDots == 0) {
      if (rawOutput == 0) {
        if (OutputFmtType == 3) {
          iVar2 = 1;
LAB_0012bc9a:
          countsummary(outf,"IntersectBothWays 1->2",iVar2,0);
        }
        else if (OutputFmtType == 2) {
          writeAltFmtXV(outf,1,(uint)(sayGroup == 0),"1->2",(dotNode *(*) [7])local_1928,drawSpike);
        }
        else if (OutputFmtType == 1) {
          writeAltFmtO(outf,1,(uint)(sayGroup == 0),"1->2",(dotNode *(*) [7])local_1928,drawSpike);
        }
        else {
          pcVar6 = "dots";
          if (groupLabel != (char *)0x0) {
            pcVar6 = groupLabel;
          }
          strcpy(local_1948,pcVar6);
          writeOutput(outf,"1->2",(dotNode *(*) [7])local_1928,drawSpike,2,local_1948,probeRad);
          if (ContactSUMMARY == '\x01') {
            iVar2 = 9;
            goto LAB_0012bc9a;
          }
        }
      }
      else {
        pcVar6 = "";
        if (groupLabel != (char *)0x0) {
          pcVar6 = groupLabel;
        }
        writeRaw(outf,"1->2",(dotNode *(*) [7])local_1928,probeRad,pcVar6,density,conFlag);
      }
    }
    else {
      iVar7 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
      if (bVar13 || bVar12) {
        if (allMainAtoms == (atom *)0x0) {
          iVar11 = 0;
        }
        else {
          iVar11 = 0;
          paVar5 = allMainAtoms;
          do {
            iVar11 = iVar11 + (paVar5->flags & 1U);
            paVar5 = paVar5->next;
          } while (paVar5 != (atom_t *)0x0);
        }
      }
      else {
        iVar11 = 0;
        iVar3 = 0;
        if (allMainAtoms != (atom *)0x0) {
          iVar3 = 0;
          paVar5 = allMainAtoms;
          do {
            iVar3 = iVar3 + (paVar5->flags & 1U);
            paVar5 = paVar5->next;
          } while (paVar5 != (atom_t *)0x0);
        }
        if (allMovingAtoms_00 != (atom *)0x0) {
          iVar11 = 0;
          paVar5 = allMovingAtoms_00;
          do {
            iVar11 = iVar11 + (paVar5->flags & 1U);
            paVar5 = paVar5->next;
          } while (paVar5 != (atom_t *)0x0);
        }
        iVar11 = iVar11 + iVar3;
      }
      if (rawOutput == 0) {
        enumerate(outf,"1->2",(dotNode *(*) [7])local_1928,probeRad,2,iVar11,drawSpike,0,iVar7,
                  density);
      }
      else {
        pcVar6 = "";
        if (groupLabel != (char *)0x0) {
          pcVar6 = groupLabel;
        }
        rawEnumerate(outf,"1->2",(dotNode *(*) [7])local_1928,2,iVar11,drawSpike,iVar2,iVar7,density
                     ,pcVar6,rawname,scoreBias);
      }
    }
    freeResults((dotNode *(*) [7])local_1928);
    memset((dotNode *(*) [7])local_1928,0,0x18f0);
    iVar2 = 1;
    genDotIntersect(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,2,1,
                    (dotNode *(*) [7])local_1928);
    if (countDots == 0) {
      if (rawOutput == 0) {
        if (OutputFmtType == 3) {
          iVar2 = 1;
        }
        else {
          if (OutputFmtType == 2) {
            uVar9 = (uint)(sayGroup == 0);
            pcVar6 = "2->1";
            goto LAB_0012bc15;
          }
          if (OutputFmtType == 1) {
            uVar9 = (uint)(sayGroup == 0);
            pcVar6 = "2->1";
            goto LAB_0012b9ab;
          }
          pcVar6 = "dots";
          if (groupLabel != (char *)0x0) {
            pcVar6 = groupLabel;
          }
          strcpy(local_1948,pcVar6);
          writeOutput(outf,"2->1",(dotNode *(*) [7])local_1928,drawSpike,2,local_1948,probeRad);
          if (ContactSUMMARY != '\x01') break;
          iVar2 = 9;
        }
        pcVar6 = "IntersectBothWays 2->1";
        iVar7 = 2;
        goto LAB_0012bd35;
      }
      pcVar6 = "";
      if (groupLabel != (char *)0x0) {
        pcVar6 = groupLabel;
      }
      pcVar10 = "2->1";
      goto LAB_0012b915;
    }
    iVar7 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,2);
    if (bVar13 || bVar12) {
      if (allMainAtoms == (atom *)0x0) {
        iVar11 = 0;
      }
      else {
        iVar11 = 0;
        do {
          iVar11 = iVar11 + (uint)(((uint)allMainAtoms->flags >> 1 & 1) != 0);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
    }
    else {
      iVar11 = 0;
      iVar3 = 0;
      if (allMainAtoms != (atom *)0x0) {
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(((uint)allMainAtoms->flags >> 1 & 1) != 0);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
      if (allMovingAtoms_00 != (atom *)0x0) {
        iVar11 = 0;
        do {
          iVar11 = iVar11 + (uint)(((uint)allMovingAtoms_00->flags >> 1 & 1) != 0);
          allMovingAtoms_00 = allMovingAtoms_00->next;
        } while (allMovingAtoms_00 != (atom_t *)0x0);
      }
      iVar11 = iVar11 + iVar3;
    }
    if (rawOutput != 0) {
      pcVar6 = "";
      if (groupLabel != (char *)0x0) {
        pcVar6 = groupLabel;
      }
      pcVar10 = "2->1";
      iVar3 = 2;
      groupLabel = pcVar6;
      goto LAB_0012ba0a;
    }
    pcVar6 = "2->1";
    iVar2 = 2;
LAB_0012ba3c:
    iVar3 = 0;
LAB_0012ba44:
    enumerate(outf,pcVar6,(dotNode *(*) [7])local_1928,probeRad,iVar2,iVar11,drawSpike,iVar3,iVar7,
              density);
    break;
  case 3:
    if ((countDots == 0 || rawOutput == 0) && ((Verbose & 1) == 0)) {
      note("SelfIntersect");
    }
    uVar4 = (ulong)(uint)modelCount;
    if (modelCount < 2) {
      uVar4 = 1;
    }
    if (modelTarg != 0 || modelSrc != 0) {
      uVar4 = 1;
    }
    modelLimit = (int)uVar4;
    pcVar6 = "dots";
    if (groupLabel != (char *)0x0) {
      pcVar6 = groupLabel;
    }
    if (groupLabel == (char *)0x0) {
      groupLabel = "";
    }
    uVar8 = 1;
    do {
      if ((1 < (int)uVar4) && (modelToProcess = modelNumber[uVar8], Verbose == 0)) {
        fprintf(_stderr,"processing modelNumber== %d\n");
      }
      if (1 < uVar8) {
        freeResults((dotNode *(*) [7])local_1928);
        memset((dotNode *(*) [7])local_1928,0,0x18f0);
      }
      iVar2 = 1;
      genDotIntersect(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,1,1,
                      (dotNode *(*) [7])local_1928);
      if (countDots == 0) {
        if (rawOutput == 0) {
          if (OutputFmtType == 3) {
            countsummary(outf,"SelfIntersect",1,1);
          }
          else if (OutputFmtType == 2) {
            descrCommand(outf,"# software:","# command:",argc,argv);
            writeAltFmtXV(outf,1,1,"self_dots",(dotNode *(*) [7])local_1928,drawSpike);
          }
          else if (OutputFmtType == 1) {
            writeAltFmtO(outf,1,1,"self_dots",(dotNode *(*) [7])local_1928,drawSpike);
          }
          else {
            if (ContactSUMMARY == '\x01') {
              countsummary(outf,"SelfIntersect",9,1);
            }
            descrCommand(outf,"@caption"," command:",argc,argv);
            if (sayGroup != 0) {
              if (modelLimit < 2) {
                fprintf((FILE *)outf,"@group dominant {%s}\n",pcVar6);
              }
              else {
                fprintf((FILE *)outf,"@group dominant {%s M%d} animate\n",pcVar6,uVar8 & 0xffffffff)
                ;
              }
            }
            strcpy(local_1948,pcVar6);
            writeOutput(outf,"self dots",(dotNode *(*) [7])local_1928,drawSpike,3,local_1948,
                        probeRad);
          }
        }
        else {
          writeRaw(outf,"1->1",(dotNode *(*) [7])local_1928,probeRad,groupLabel,density,conFlag);
        }
      }
      else {
        if (rawOutput == 0) {
          descrCommand(outf,"program:","command:",argc,argv);
        }
        iVar7 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
        if (rawOutput == 0) {
          fprintf((FILE *)outf,"selection: self\nname: %s\n",pcVar6);
          fprintf((FILE *)outf,
                  "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
                  (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
          fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
                  (double)BUMPweight,(double)HBweight);
        }
        if (bVar13 || bVar12) {
          if (allMainAtoms == (atom *)0x0) {
            iVar11 = 0;
          }
          else {
            iVar11 = 0;
            paVar5 = allMainAtoms;
            do {
              iVar11 = iVar11 + (paVar5->flags & 1U);
              paVar5 = paVar5->next;
            } while (paVar5 != (atom_t *)0x0);
          }
        }
        else {
          iVar11 = 0;
          iVar3 = 0;
          if (allMainAtoms != (atom *)0x0) {
            iVar3 = 0;
            paVar5 = allMainAtoms;
            do {
              iVar3 = iVar3 + (paVar5->flags & 1U);
              paVar5 = paVar5->next;
            } while (paVar5 != (atom_t *)0x0);
          }
          if (allMovingAtoms_00 != (atom *)0x0) {
            iVar11 = 0;
            paVar5 = allMovingAtoms_00;
            do {
              iVar11 = iVar11 + (paVar5->flags & 1U);
              paVar5 = paVar5->next;
            } while (paVar5 != (atom_t *)0x0);
          }
          iVar11 = iVar11 + iVar3;
        }
        if (rawOutput == 0) {
          enumerate(outf,"self dots",(dotNode *(*) [7])local_1928,probeRad,3,iVar11,drawSpike,0,
                    iVar7,density);
        }
        else {
          rawEnumerate(outf,"",(dotNode *(*) [7])local_1928,3,iVar11,drawSpike,iVar2,iVar7,density,
                       groupLabel,rawname,scoreBias);
        }
      }
      uVar4 = (ulong)modelLimit;
      bVar1 = (long)uVar8 < (long)uVar4;
      uVar8 = uVar8 + 1;
    } while (bVar1);
    break;
  case 4:
    if ((rawOutput == 0) && ((Verbose & 1) == 0)) {
      note("dumpAtomInfo");
      descrCommand(outf,"program:","command:",argc,argv);
      pcVar6 = "dots";
      if (groupLabel != (char *)0x0) {
        pcVar6 = groupLabel;
      }
      fprintf((FILE *)outf,"selection: self\nname: %s\n",pcVar6);
      fprintf((FILE *)outf,
              "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
              (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
      fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
              (double)BUMPweight,(double)HBweight);
    }
    if (bVar13 || bVar12) {
      uVar4 = 0;
      for (; allMainAtoms != (atom *)0x0; allMainAtoms = allMainAtoms->next) {
        uVar4 = (ulong)((int)uVar4 + (allMainAtoms->flags & 1U));
      }
    }
    else {
      iVar7 = 0;
      iVar2 = 0;
      if (allMainAtoms != (atom *)0x0) {
        iVar2 = 0;
        do {
          iVar2 = iVar2 + (allMainAtoms->flags & 1U);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
      if (allMovingAtoms_00 != (atom *)0x0) {
        iVar7 = 0;
        do {
          iVar7 = iVar7 + (allMovingAtoms_00->flags & 1U);
          allMovingAtoms_00 = allMovingAtoms_00->next;
        } while (allMovingAtoms_00 != (atom_t *)0x0);
      }
      uVar4 = (ulong)(uint)(iVar7 + iVar2);
    }
    if (rawOutput == 0) {
      fprintf((FILE *)outf,"atoms selected: %d\n",uVar4);
    }
    else if (groupLabel == (char *)0x0) {
      fprintf((FILE *)outf,"%d %s\n",uVar4,rawname);
    }
    else {
      fprintf((FILE *)outf,"%d %s %s%s\n",uVar4,rawname,"#",groupLabel);
    }
  }
  freeResults((dotNode *(*) [7])local_1928);
  return;
}

Assistant:

void doCommand(FILE *outf, int method,
   atom *allMainAtoms, atomBins *abins,
   atom *allMovingAtoms, atomBins *bbins,
   pointSet dots[], float probeRad, float density, float spikelen,
   int countDots, int rawOutput, int conFlag, char* rawname, double scoreBias,
   int drawSpike, int sayGroup, char* groupLabel,
   int argc, char **argv, char message[])
{

/* NOTE: allMainAtoms/abins & allMovingAtoms/bbins must be disjoint */
/*       sets of atoms (none in common) or allMovingAtoms/bbins can */
/*       be NULL.                                                   */
/*       allMovingAtoms refers to autobondrot set of atoms          */

   /*doCommand is called from mainProbeProc() with rawname=="" */
   /* and called from movingDoCommand() with rawname==orientationName */
   /* which holds the string of the current autobondrot cycle's angle values*/
   /*for autobondrot: method is set by probe command, e.g. */
   /* INTERSECTONCE==1 as used in example of mobile sidechain in a protein */
   /* SELFINTERSECT==3 as used by alaphitaupsi ramachandran calculation*/
   /* autobondrot option defines: countDots==1, rawOutput==1*/
   /* autobondrot seems to get here with: drawSpike==1*/

   dotNode *rslts[NUMATOMTYPES][NODEWIDTH];
   int nsel = 0, numSkinDots = 0;
   int usesMovingAtoms = FALSE;

   int  j=0;

   char extrastr[32]; /*060129 for extra master to control orig vs fitted dots*/

   /*allMovingAtoms is closest thing to a flag for autobondrot mode*/
   /*so if it exists and bbins exist (dcr?: mobile atoms near enough?) */
   /*then usesMovingAtoms becomes the flag for autobondrot mode */
   /*in effect probe is modal but too object oriented to admit such globalness*/

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));
   if (! usesMovingAtoms)
   {
	allMovingAtoms = NULL;
	bbins = NULL;
   }

   initResults(rslts);
   if (!countDots && rawOutput && Verbose)
   { /*write rawOutput col headers*/
        if (OldStyleU)
        {
        	if(conFlag)
        		note(">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:"
        		"kissEdge2BullsEye:dot2BE:dot2SC:spike:score:"
        		"stype:ttype:x:y:z:sBval:tBval");
        	else
        		note(">>name:pat:type:srcAtom:targAtom:min-gap:gap:"
        		"kissEdge2BullsEye:dot2BE:dot2SC:spike:score:"
        		"stype:ttype:x:y:z:sBval:tBval");
       }
       else
       {
       	       if(conFlag)
       	      		 note(">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:"
       	       	       "spX:spY:spZ:spikeLen:score:"
              	       "stype:ttype:x:y:z:sBval:tBval");
              else
              	   note(">>name:pat:type:srcAtom:targAtom:min-gap:gap:"
       	       	       "spX:spY:spZ:spikeLen:score:"
              	       "stype:ttype:x:y:z:sBval:tBval");
       }
   }/*write rawOutput col headers*/
   if (method == SELFINTERSECT)
   {/*{{{(method == SELFINTERSECT)___expected default method___****/
   	   if (Verbose && !(countDots && rawOutput))
   		note("SelfIntersect");

    /*SELFINTERSECT case, using one input file (and where srcPat == targPat)*/
    /*is where unwashed NMR files with multiple models can be processed */
    /*when there is not a single model specified in the pattern.*/
    /*This uses a loop through all the model numbers actually in the file.*/

    	  if(modelSrc == 0 && modelTarg == 0 && modelCount > 1) /*041114*/ /*multiple models in file but no model specified in pattern*/
    	        modelLimit = modelCount;
          else
   		modelLimit = 1;

   	  for(j = 1; j <= modelLimit; j++) /*041114*/
   	  {/*loop over models*/

   	  	  if(modelLimit > 1)
   	  	  {/*defines the multiple model case*/
   	  	  	  modelToProcess = modelNumber[j]; /*models can be in any order 041114*/
   	  	  	  if(Verbose)
   	  	  	    	  fprintf(stderr,"processing modelNumber== %d\n",modelNumber[j]);
   	  	  }
   	  	  if(j > 1)
   	  	  {
   	  	  	  freeResults(rslts);
   	  	  	  initResults(rslts);
   	  	  }
   	  	  genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,dots, probeRad, spikelen,SET1, SET1, rslts);
   	  	  /*does this for all atoms... calls examineDots()*/

          
   	  	  if (countDots)
   	  	  {/*autobondrot sets this, commandline can set this*/
   	  	  	  if (!rawOutput) {descrCommand(outf, "program:", "command:", argc, argv);}
   	  	  	  numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
   	  	  	  /*numSkinDots used to normalize output score*/
   	  	  	  if (!rawOutput)
   	  	  	  {
   	  	  	  	  fprintf(outf, "selection: self\nname: %s\n", groupLabel?groupLabel:"dots");
   	  	  	  	  fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
   	  	  	  	  	  density, probeRad, RadScaleFactor, RadScaleOffset);
   	  	  	  	  fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
   	  	  	  	  	  GAPweight, BUMPweight, HBweight);
   	  	  	  }
   	  	  	  if (usesMovingAtoms)
   	  	  	    	  nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
   	  	  	  else
   	  	  	    	  nsel = countSelected(allMainAtoms, SET1);

   	  	  	  if (rawOutput)
   	  	  	  {/*autobondrot sets this*/
   	  	  	  	  rawEnumerate(outf, "", rslts, method,
   	  	  	  	  	  nsel, drawSpike, FALSE, numSkinDots, density,
   	  	  	  	  	  groupLabel?groupLabel:"", rawname, scoreBias);
   	  	  	  }
   	  	  	  else
   	  	  	  {
   	  	  	  	  enumerate(outf, "self dots", rslts, probeRad, method, nsel,
   	  	  	  	  	  drawSpike, FALSE, numSkinDots, density);
   	  	  	  }
   	  	  }/*countDots*/
   	  	  else
   	  	  {
   	  	  	  if (rawOutput)
				{
   	  	  	    	  writeRaw(outf, "1->1", rslts, probeRad,groupLabel?groupLabel:"", density,conFlag);
				}
   	  	  	  else if (OutputFmtType == 1)
   	  	  	   	  writeAltFmtO(outf, TRUE, TRUE, "self_dots", rslts, drawSpike);
   	  	  	  else if (OutputFmtType == 2)
   	  	  	  {
   	  	  	  	  descrCommand(outf, "# software:", "# command:", argc, argv);
   	  	  	  	  writeAltFmtXV(outf, TRUE, TRUE, "self_dots", rslts, drawSpike);
   	  	  	  }
   	  	  	  else if (OutputFmtType == 3)
   	  	  	  { /*dcr041101 ONELINE :count:summaries:*/
   	  	  	  	  countsummary(outf,"SelfIntersect", 1, 1); /*dcr041101 Lines,Pass*/
   	  	  	  }
   	  	  	  else
   	  	  	  {/*kinemage output*/
   	  	  	  	  if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
   	  	  	  	    	countsummary(outf,"SelfIntersect", 9, 1);

   	  	  	  	  descrCommand(outf, "@caption", " command:", argc, argv);

   	  	  	  	  if (sayGroup)
   	  	  	  	  {
   	  	  	  	  	  if(modelLimit > 1)
   	  	  	  	  	  {/*doing jth of multiple models of an ensemble*/
   	  	  	  	  	  	  fprintf(outf, "@group dominant {%s M%d} animate\n",groupLabel?groupLabel:"dots",j);
   	  	  	  	  	  }
   	  	  	  	  	  else
   	  	  	  	  	    	  fprintf(outf, "@group dominant {%s}\n",groupLabel?groupLabel:"dots");
   	  	  	  	  }
   	  	  	  	  sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
                  writeOutput(outf, "self dots", rslts, drawSpike, method, extrastr, probeRad);
                           /*add probeRad 20111220dcr*/
   	  	  	  }/*kinemage output*/
   	  	  }
   	  }/*loop over models*/
   }/*}}}(method == SELFINTERSECT)________________________________*/

   else if (method == INTERSECTONCE)
   {/*{{{(method == INTERSECTONCE)*********************************/
      if (Verbose && !(countDots && rawOutput))
      	      note("IntersectOnce");

      genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,dots, probeRad, spikelen, SET1, SET2, rslts);

      if (countDots)
      {/*autobondrot sets this*/
      	      if (!rawOutput)
      	      	      descrCommand(outf, "program:", "command:", argc, argv);

      	      numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
         /*numSkinDots used to normalize output score*/
              if (!rawOutput)
	      {
	 	     fprintf(outf, "selection: once\nname: %s\n", groupLabel?groupLabel:"dots");
	 	     fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
	 	     	     density, probeRad, RadScaleFactor, RadScaleOffset);
		     fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
		     	     GAPweight, BUMPweight, HBweight);
	      }
	      if (usesMovingAtoms)
	      	      nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
              else
              	      nsel = countSelected(allMainAtoms, SET1);

              if (rawOutput)
              {/*autobondrot sets this*/
              	      rawEnumerate(outf,"", rslts, method, nsel,
              	      	      drawSpike, FALSE, numSkinDots, density,
              	      	      groupLabel?groupLabel:"", rawname, scoreBias);
              }
              else
              {
              	      enumerate(outf,"once dots", rslts, probeRad, method, nsel,
              	      	      drawSpike, FALSE, numSkinDots, density);
              }
      }
      else
      {
      	      if (rawOutput)
		{
      	      	    writeRaw(outf, "1->2", rslts, probeRad,groupLabel?groupLabel:"", density,conFlag);

		}
		else if (OutputFmtType == 1)
	      	      writeAltFmtO(outf, TRUE, TRUE, "once_dots", rslts, drawSpike);
	      else if (OutputFmtType == 2)
	      {
	      	      descrCommand(outf, "# software:", "# command:", argc, argv);
	      	      writeAltFmtXV(outf, TRUE, TRUE, "once_dots", rslts, drawSpike);
	      }
	      else if (OutputFmtType == 3)
	      { /*dcr041101 ONELINE :count:summaries:*/
	      	      countsummary(outf,"IntersectOnce", 1, 1); /*dcr041101 Lines,Pass*/
	      }
	      else
	      {/*write kinemage*/
	      	      if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
               			countsummary(outf,"IntersectOnce", 9, 1);

               	      descrCommand(outf, "@caption", " command:", argc, argv);
               	      if (sayGroup)
               	      	      fprintf(outf, "@group dominant {%s}\n", groupLabel?groupLabel:"dots");

               	      sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
                         writeOutput(outf, "once dots", rslts, drawSpike, method, extrastr, probeRad);
                         /*add probeRad 20111220dcr*/
              }
      }
   }/*}}}(method == INTERSECTONCE)________________________________*/

   else if (method == INTERSECTBOTHWAYS)
   {/*{{{(method == INTERSECTBOTHWAYS)*****************************/
      if (Verbose && !(countDots && rawOutput))
      		note("IntersectBothWays");

      if (countDots)
      {
	 if (!rawOutput)
	 {
	    descrCommand(outf, "program:", "command:", argc, argv);
	    fprintf(outf, "selection: both\nname: %s\n", groupLabel?groupLabel:"dots");
	    fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
				 density, probeRad, RadScaleFactor, RadScaleOffset);
	    fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
				 GAPweight, BUMPweight, HBweight);
	 }
      }
      else
      {
      	      if (rawOutput) {}
		   /* do nothing on purpose */
	      else if (OutputFmtType == 1) {}
	      else if (OutputFmtType == 2)
	      	      descrCommand(outf, "# software:", "# command:", argc, argv);
	      else
	      {/*kinemage: keywords before double pass*/
	      	      descrCommand(outf, "@caption", " command:", argc, argv);
	      	      if (sayGroup)
	      	      		fprintf(outf, "@group {%s}\n",groupLabel?groupLabel:"dots");
	    }
      }

      genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,
		  dots, probeRad, spikelen, SET1, SET2, rslts);

      if (countDots)
      {
	 numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
         /*numSkinDots used to normalize output score*/
	 if (usesMovingAtoms)
	     nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
	 else
             nsel = countSelected(allMainAtoms, SET1);

	 if (rawOutput)
	 {
	    rawEnumerate(outf, "1->2", rslts, method, nsel,
			drawSpike, FALSE, numSkinDots, density,
			groupLabel?groupLabel:"", rawname, scoreBias);
	 }
	 else
	 {
	    enumerate(outf, "1->2", rslts, probeRad, method, nsel,
			drawSpike, FALSE, numSkinDots, density);
	 }
      }
      else
      {
	 if (rawOutput)
	{
	    writeRaw(outf, "1->2", rslts, probeRad, groupLabel?groupLabel:"", density,conFlag);

	}
	else if (OutputFmtType == 1)
	    writeAltFmtO(outf, TRUE, !sayGroup, "1->2", rslts, drawSpike);
	 else if (OutputFmtType == 2)
	    writeAltFmtXV(outf, TRUE, !sayGroup, "1->2", rslts, drawSpike);
	 else if (OutputFmtType == 3)
	 { /*dcr041101 ONELINE :count:summaries:*/
            countsummary(outf,"IntersectBothWays 1->2", 1, 0);
            /*dcr041101 Lines,Pass==0 no output for this pass*/
	 }
	 else
	 {
            sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
        writeOutput(outf, "1->2", rslts, drawSpike, method, extrastr,probeRad);
        /*add probeRad 20111220dcr*/

            if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
             	countsummary(outf,"IntersectBothWays 1->2", 9, 0);
               /*dcr041101 Lines,Pass==0 no output for this pass*/
	 }
      }
      freeResults(rslts);
      initResults(rslts);

      genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,
			dots, probeRad, spikelen, SET2, SET1, rslts);

      if (countDots)
      {
	 numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET2);
         /*numSkinDots used to normalize output score*/
	 if (usesMovingAtoms)
	 	 nsel = countSelected(allMainAtoms,   SET2) + countSelected(allMovingAtoms, SET2);
	 else
	 	 nsel = countSelected(allMainAtoms, SET2);

	 if (rawOutput)
	 {
	    rawEnumerate(outf, "2->1", rslts, method, nsel,
			drawSpike, FALSE, numSkinDots, density,
			groupLabel?groupLabel:"", rawname, scoreBias);
	 }
	 else
	 {
	    enumerate(outf, "2->1", rslts, probeRad, method, nsel,
			drawSpike, FALSE, numSkinDots, density);
	 }
      }
      else
      {
	 if (rawOutput)
	 {
         writeRaw(outf, "2->1", rslts, probeRad,
			groupLabel?groupLabel:"", density,conFlag);

	 }
	 else if (OutputFmtType == 1)
	 {
	    writeAltFmtO(outf, !sayGroup, TRUE, "2->1", rslts, drawSpike);
	 }
	 else if (OutputFmtType == 2)
	 {
	    writeAltFmtXV(outf, !sayGroup, TRUE, "2->1", rslts, drawSpike);
	 }
	 else if (OutputFmtType == 3)
	 { /*dcr041101 ONELINE :count:summaries:*/
            countsummary(outf,"IntersectBothWays 2->1", 1, 2);
            /*dcr041101 Lines,Pass==2 output sum of 2 passes*/
	 }
	 else
	 {
            sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
        writeOutput(outf, "2->1", rslts, drawSpike, method, extrastr, probeRad);
        /*add probeRad 20111220dcr*/

            if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
               countsummary(outf,"IntersectBothWays 2->1", 9, 2);
               /*dcr041101 Lines,Pass==2 output sum of 2 passes*/
	 }
      }
   }/*}}}(method == INTERSECTBOTHWAYS)____________________________*/

   else if (method == EXTERNALSURFACE)
   {/*{{{(method == EXTERNALSURFACE)*******************************/
      if (Verbose && !(countDots && rawOutput))
      	      note("ExternalSurface");

      genDotSurface(allMainAtoms, abins, allMovingAtoms, bbins, dots, probeRad, spikelen, SET1, rslts);

      if (countDots)
      {
	 if (!rawOutput)
	    descrCommand(outf, "program:", "command:", argc, argv);

	 numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
         /*numSkinDots used to normalize output score*/
	 if (!rawOutput)
	 {
	    fprintf(outf, "selection: external\nname: %s\n",groupLabel?groupLabel:"dots");
	    fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
		     density, probeRad, RadScaleFactor, RadScaleOffset);
	 }
	 if (usesMovingAtoms)
	 	 nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
	 else
	 	 nsel = countSelected(allMainAtoms, SET1);

	 if (rawOutput)
	 {
	    rawEnumerate(outf, "", rslts, method, nsel,
		     FALSE, TRUE, numSkinDots, density,
		     groupLabel?groupLabel:"", rawname, scoreBias);
	 }
	 else
	 {
	    enumerate(outf, "extern dots", rslts, probeRad, method, nsel,
		     FALSE, TRUE, numSkinDots, density);
	 }
      }
      else
      {
	 if (rawOutput)
	 {
	    writeRaw(outf, "1->none", rslts, probeRad,
		  groupLabel?groupLabel:"", density,conFlag);

	 }
	 else if (OutputFmtType == 1)
	 {
	    writeAltFmtO(outf, TRUE, TRUE, "extern_dots", rslts, FALSE);
	 }
	 else if (OutputFmtType == 2)
	 {
	    descrCommand(outf, "# software:", "# command:", argc, argv);
	    writeAltFmtXV(outf, TRUE, TRUE, "extern_dots", rslts, FALSE);
	 }
	 else
	 {
	    descrCommand(outf, "@caption", " command:", argc, argv);
	    if (sayGroup)
	       	fprintf(outf, "@group dominant {%s}\n", groupLabel?groupLabel:"dots");

            sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
        writeOutput(outf, "extern dots", rslts, FALSE, method, extrastr, probeRad);
        /*add probeRad 20111220dcr*/
	 }
      }
   }/*}}}(method == EXTERNALSURFACE)______________________________*/

   else if (method == DUMPATOMCOUNT)
   {/*{{{(method == DUMPATOMCOUNT)*********************************/
      if (Verbose && !rawOutput)
      {
	 note("dumpAtomInfo");
	 descrCommand(outf, "program:", "command:", argc, argv);
	 fprintf(outf, "selection: self\nname: %s\n", groupLabel?groupLabel:"dots");
	 fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
				 density, probeRad, RadScaleFactor, RadScaleOffset);
	 fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
				 GAPweight, BUMPweight, HBweight);
      }
      if (usesMovingAtoms)
	 nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
      else
	 nsel = countSelected(allMainAtoms, SET1);

      if (rawOutput)
      {
	 if (groupLabel)
	 {
	    fprintf(outf, "%d %s %s%s\n", nsel, rawname,
	       RAW_HEADER_COMMENT, groupLabel);
	 }
	 else
	 {
	    fprintf(outf, "%d %s\n", nsel, rawname);
	 }
      }
      else
      {
	 fprintf(outf, "atoms selected: %d\n", nsel);
      }
   }/*}}}(method == DUMPATOMCOUNT)_______________________________*/

   freeResults(rslts);

}